

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

ScatterLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatter(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3a7) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3a7;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ScatterLayerParams::ScatterLayerParams(this_00.scatter_);
    (this->layer_).scatter_ = (ScatterLayerParams *)this_00;
  }
  return (ScatterLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterLayerParams* NeuralNetworkLayer::mutable_scatter() {
  if (!has_scatter()) {
    clear_layer();
    set_has_scatter();
    layer_.scatter_ = new ::CoreML::Specification::ScatterLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatter)
  return layer_.scatter_;
}